

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timBox.c
# Opt level: O0

int Tim_ManBoxFindFromCiNum(Tim_Man_t *p,int iCiNum)

{
  int iVar1;
  int local_2c;
  int i;
  Tim_Box_t *pBox;
  int iCiNum_local;
  Tim_Man_t *p_local;
  
  if ((-1 < iCiNum) && (iVar1 = Tim_ManCiNum(p), iCiNum < iVar1)) {
    iVar1 = Tim_ManPiNum(p);
    if (iCiNum < iVar1) {
      p_local._4_4_ = -1;
    }
    else {
      for (local_2c = 0; iVar1 = Vec_PtrSize(p->vBoxes), local_2c < iVar1; local_2c = local_2c + 1)
      {
        Vec_PtrEntry(p->vBoxes,local_2c);
        iVar1 = Tim_ManBoxOutputFirst(p,local_2c);
        if (iCiNum < iVar1) {
          return local_2c + -1;
        }
      }
      p_local._4_4_ = -2;
    }
    return p_local._4_4_;
  }
  __assert_fail("iCiNum >= 0 && iCiNum < Tim_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/tim/timBox.c"
                ,0x137,"int Tim_ManBoxFindFromCiNum(Tim_Man_t *, int)");
}

Assistant:

int Tim_ManBoxFindFromCiNum( Tim_Man_t * p, int iCiNum )
{
    Tim_Box_t * pBox;
    int i;
    assert( iCiNum >= 0 && iCiNum < Tim_ManCiNum(p) );
    if ( iCiNum < Tim_ManPiNum(p) )
        return -1;
    Tim_ManForEachBox( p, pBox, i )
        if ( iCiNum < Tim_ManBoxOutputFirst(p, i) )
            return i - 1;
    return -2;
}